

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void __thiscall
SmallArray<CompilerStatistics::Timer,_16U>::~SmallArray
          (SmallArray<CompilerStatistics::Timer,_16U> *this)

{
  Timer *pTVar1;
  
  pTVar1 = this->data;
  if (pTVar1 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (pTVar1 != (Timer *)0x0) {
        (*(code *)NULLC::dealloc)(pTVar1);
      }
    }
    else if (pTVar1 != (Timer *)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  return;
}

Assistant:

~SmallArray()
	{
		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}
	}